

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpselect.h
# Opt level: O0

int jrtplib::RTPSelect(SocketType *sockets,int8_t *readflags,size_t numsocks,RTPTime timeout)

{
  int iVar1;
  reference pvVar2;
  double dVar3;
  pointer local_88;
  size_t i_1;
  double dStack_78;
  int status;
  double dtimeoutmsec;
  pointer ppStack_68;
  int timeoutmsec;
  size_t i;
  allocator<pollfd> local_49;
  undefined1 local_48 [8];
  vector<pollfd,_std::allocator<pollfd>_> fds;
  size_t numsocks_local;
  int8_t *readflags_local;
  SocketType *sockets_local;
  RTPTime timeout_local;
  
  fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)numsocks;
  sockets_local = (SocketType *)timeout.m_t;
  std::allocator<pollfd>::allocator(&local_49);
  std::vector<pollfd,_std::allocator<pollfd>_>::vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)local_48,numsocks,&local_49);
  std::allocator<pollfd>::~allocator(&local_49);
  for (ppStack_68 = (pointer)0x0;
      ppStack_68 <
      fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage; ppStack_68 = (pointer)((long)&ppStack_68->fd + 1)) {
    iVar1 = sockets[(long)ppStack_68];
    pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                       ((vector<pollfd,_std::allocator<pollfd>_> *)local_48,(size_type)ppStack_68);
    pvVar2->fd = iVar1;
    pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                       ((vector<pollfd,_std::allocator<pollfd>_> *)local_48,(size_type)ppStack_68);
    pvVar2->events = 1;
    pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                       ((vector<pollfd,_std::allocator<pollfd>_> *)local_48,(size_type)ppStack_68);
    pvVar2->revents = 0;
    readflags[(long)ppStack_68] = '\0';
  }
  dtimeoutmsec._4_4_ = -1;
  dVar3 = RTPTime::GetDouble((RTPTime *)&sockets_local);
  if (0.0 <= dVar3) {
    dStack_78 = RTPTime::GetDouble((RTPTime *)&sockets_local);
    dStack_78 = dStack_78 * 1000.0;
    iVar1 = std::numeric_limits<int>::max();
    if ((double)iVar1 < dStack_78) {
      iVar1 = std::numeric_limits<int>::max();
      dStack_78 = (double)iVar1;
    }
    dtimeoutmsec._4_4_ = (int)dStack_78;
  }
  pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                     ((vector<pollfd,_std::allocator<pollfd>_> *)local_48,0);
  timeout_local.m_t._4_4_ =
       poll((pollfd *)pvVar2,
            (nfds_t)fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,dtimeoutmsec._4_4_);
  if (timeout_local.m_t._4_4_ < 0) {
    timeout_local.m_t._4_4_ = -0xb4;
  }
  else if (0 < timeout_local.m_t._4_4_) {
    for (local_88 = (pointer)0x0;
        local_88 <
        fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage; local_88 = (pointer)((long)&local_88->fd + 1)) {
      pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                         ((vector<pollfd,_std::allocator<pollfd>_> *)local_48,(size_type)local_88);
      if (pvVar2->revents != 0) {
        readflags[(long)local_88] = '\x01';
      }
    }
  }
  std::vector<pollfd,_std::allocator<pollfd>_>::~vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)local_48);
  return timeout_local.m_t._4_4_;
}

Assistant:

inline int RTPSelect(const SocketType *sockets, int8_t *readflags, size_t numsocks, RTPTime timeout)
{
	using namespace std;

	vector<struct pollfd> fds(numsocks);

	for (size_t i = 0 ; i < numsocks ; i++)
	{
		fds[i].fd = sockets[i];
		fds[i].events = POLLIN;
		fds[i].revents = 0;
		readflags[i] = 0;
	}

	int timeoutmsec = -1;
	if (timeout.GetDouble() >= 0)
	{
		double dtimeoutmsec = timeout.GetDouble()*1000.0;
		if (dtimeoutmsec > (numeric_limits<int>::max)()) // parentheses to prevent windows 'max' macro expansion
			dtimeoutmsec = (numeric_limits<int>::max)();
		
		timeoutmsec = (int)dtimeoutmsec;
	}

#ifdef RTP_HAVE_WSAPOLL
	int status = WSAPoll(&(fds[0]), (ULONG)numsocks, timeoutmsec);
#else
	int status = poll(&(fds[0]), numsocks, timeoutmsec);
#endif // RTP_HAVE_WSAPOLL
	if (status < 0)
		return ERR_RTP_SELECT_ERRORINPOLL;

	if (status > 0)
	{
		for (size_t i = 0 ; i < numsocks ; i++)
		{
			if (fds[i].revents)
				readflags[i] = 1;
		}
	}
	return status;
}